

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

int authorize(mg_connection *conn,mg_file *filep,char *realm)

{
  byte *pbVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  uchar *puVar5;
  ushort **ppuVar6;
  char *pcVar7;
  ulonglong uVar8;
  ulong uVar9;
  size_t sVar10;
  uchar uVar11;
  ulong uVar12;
  ah *paVar13;
  mg_context *ctx;
  uchar *puVar14;
  bool bVar15;
  char buf [8192];
  uchar *local_22f8;
  mg_connection *local_22f0;
  char *local_22e8;
  mg_file *local_22e0;
  size_t local_22d8;
  read_auth_file_struct local_22d0;
  uchar local_2038 [8200];
  
  if (conn->dom_ctx == (mg_domain_context *)0x0) {
    return 0;
  }
  memset(&local_22d0.domain,0,0x248);
  local_22d0.ah.user = (char *)0x0;
  local_22d0.ah.type = 0;
  local_22d0.ah._12_4_ = 0;
  local_22d0.ah.plain_password = (char *)0x0;
  local_22d0.ah.uri = (char *)0x0;
  local_22d0.ah.cnonce = (char *)0x0;
  local_22d0.ah.response = (char *)0x0;
  local_22d0.ah.qop = (char *)0x0;
  local_22d0.ah.nc = (char *)0x0;
  local_22d0.ah.nonce = (char *)0x0;
  local_22d0.conn = conn;
  pcVar4 = mg_get_header(conn,"Authorization");
  if (pcVar4 == (char *)0x0) {
    return 0;
  }
  iVar3 = mg_strncasecmp(pcVar4,"Basic ",6);
  if (iVar3 == 0) {
    sVar10 = strlen(pcVar4 + 6);
    local_22d8 = 0x2000;
    iVar3 = mg_base64_decode(pcVar4 + 6,sVar10,local_2038,&local_22d8);
    if (iVar3 == -1) {
      puVar5 = local_2038;
      pcVar4 = strchr((char *)puVar5,0x3a);
      if (pcVar4 != (char *)0x0) {
        *pcVar4 = '\0';
        local_22d0.ah.type = 1;
        local_22d0.ah.plain_password = pcVar4 + 1;
        bVar15 = true;
        local_22d0.ah.user = (char *)puVar5;
        goto LAB_0010f138;
      }
    }
    puVar5 = (uchar *)0x0;
    bVar15 = false;
  }
  else {
    iVar3 = mg_strncasecmp(pcVar4,"Digest ",7);
    if (iVar3 != 0) {
      return 0;
    }
    local_22d0.ah.type = 2;
    uVar11 = pcVar4[7];
    local_22f8 = local_2038;
    puVar5 = local_22f8;
    if (uVar11 != '\0') {
      puVar14 = (uchar *)(pcVar4 + 8);
      puVar5 = local_2038;
      uVar12 = 0x1fff;
      do {
        *puVar5 = uVar11;
        puVar5 = puVar5 + 1;
        uVar11 = *puVar14;
        if (uVar11 == '\0') break;
        puVar14 = puVar14 + 1;
        bVar15 = 1 < uVar12;
        uVar12 = uVar12 - 1;
      } while (bVar15);
    }
    *puVar5 = '\0';
    local_22f0 = conn;
    local_22e8 = realm;
    local_22e0 = filep;
    ppuVar6 = __ctype_b_loc();
    while( true ) {
      local_22f8 = local_22f8 + -1;
      do {
        pbVar1 = local_22f8 + 1;
        uVar12 = (ulong)*pbVar1;
        local_22f8 = local_22f8 + 1;
      } while ((*(byte *)((long)*ppuVar6 + uVar12 * 2 + 1) & 0x20) != 0);
      pcVar4 = skip_quoted((char **)&local_22f8,"=",(char *)0x0,*pbVar1);
      if (*local_22f8 == '\"') {
        local_22f8 = local_22f8 + 1;
        pcVar7 = skip_quoted((char **)&local_22f8,"\"",(char *)0x5c,(char)uVar12);
        if (*local_22f8 == ',') {
          local_22f8 = local_22f8 + 1;
        }
      }
      else {
        pcVar7 = skip_quoted((char **)&local_22f8,", ",(char *)0x0,(char)uVar12);
      }
      filep = local_22e0;
      realm = local_22e8;
      conn = local_22f0;
      cVar2 = *pcVar4;
      if (cVar2 == '\0') break;
      iVar3 = strcmp(pcVar4,"username");
      paVar13 = &local_22d0.ah;
      if (iVar3 == 0) goto LAB_0010f020;
      iVar3 = strcmp(pcVar4,"cnonce");
      paVar13 = (ah *)&local_22d0.ah.cnonce;
      if (iVar3 == 0) goto LAB_0010f020;
      iVar3 = strcmp(pcVar4,"response");
      paVar13 = (ah *)&local_22d0.ah.response;
      if (iVar3 == 0) goto LAB_0010f020;
      iVar3 = strcmp(pcVar4,"uri");
      paVar13 = (ah *)&local_22d0.ah.uri;
      if (iVar3 == 0) goto LAB_0010f020;
      iVar3 = strcmp(pcVar4,"qop");
      paVar13 = (ah *)&local_22d0.ah.qop;
      if ((iVar3 == 0) ||
         (((cVar2 == 'n' && (pcVar4[1] == 'c')) &&
          (paVar13 = (ah *)&local_22d0.ah.nc, pcVar4[2] == '\0')))) goto LAB_0010f020;
      iVar3 = strcmp(pcVar4,"nonce");
      paVar13 = (ah *)&local_22d0.ah.nonce;
      if (iVar3 == 0) {
LAB_0010f020:
        paVar13->user = pcVar7;
      }
    }
    if (local_22d0.ah.nonce == (char *)0x0) {
      return 0;
    }
    local_22f8 = (uchar *)0x0;
    uVar8 = strtoull(local_22d0.ah.nonce,(char **)&local_22f8,10);
    if (local_22f8 == (uchar *)0x0) {
      return 0;
    }
    if (*local_22f8 != '\0') {
      return 0;
    }
    uVar9 = uVar8 ^ conn->dom_ctx->auth_nonce_mask;
    uVar12 = conn->phys_ctx->start_time;
    if (uVar9 < uVar12) {
      return 0;
    }
    if (uVar12 + conn->dom_ctx->nonce_count <= uVar9) {
      return 0;
    }
    bVar15 = (uchar *)local_22d0.ah.user != (uchar *)0x0;
    puVar5 = (uchar *)local_22d0.ah.user;
  }
LAB_0010f138:
  if (!bVar15) {
    return 0;
  }
  sVar10 = strlen((char *)puVar5);
  pcVar4 = mg_strndup_ctx((char *)puVar5,sVar10,ctx);
  (conn->request_info).remote_user = pcVar4;
  if (realm == (char *)0x0) {
    realm = conn->dom_ctx->config[0x1e];
  }
  local_22d0.domain = realm;
  iVar3 = read_auth_file(filep,&local_22d0,9);
  return iVar3;
}

Assistant:

static int
authorize(struct mg_connection *conn, struct mg_file *filep, const char *realm)
{
	struct read_auth_file_struct workdata;
	char buf[MG_BUF_LEN];

	if (!conn || !conn->dom_ctx) {
		return 0;
	}

	memset(&workdata, 0, sizeof(workdata));
	workdata.conn = conn;

	if (!parse_auth_header(conn, buf, sizeof(buf), &workdata.ah)) {
		return 0;
	}

	/* CGI needs it as REMOTE_USER */
	conn->request_info.remote_user =
	    mg_strdup_ctx(workdata.ah.user, conn->phys_ctx);

	if (realm) {
		workdata.domain = realm;
	} else {
		workdata.domain = conn->dom_ctx->config[AUTHENTICATION_DOMAIN];
	}

	return read_auth_file(filep, &workdata, INITIAL_DEPTH);
}